

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::operator&(Mat *this,int b)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong *puVar4;
  int in_EDX;
  int *in_RSI;
  Mat *in_RDI;
  int i;
  int l;
  Mat *ret;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  
  Mat((Mat *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
      (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  iVar3 = *in_RSI * in_RSI[1];
  for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    puVar4 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RSI + 4),
                                 (long)iVar5);
    uVar1 = *puVar4;
    uVar2 = puVar4[1];
    puVar4 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                (&in_RDI->val,(long)iVar5);
    puVar4[1] = uVar2 & (long)in_EDX >> 0x3f;
    *puVar4 = uVar1 & (long)in_EDX;
  }
  return in_RDI;
}

Assistant:

Mat Mat::operator&(int b) const {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] & b;
    }
    return ret;
}